

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8_t * __thiscall
google::protobuf::ExtensionRangeOptions_Declaration::_InternalSerialize
          (ExtensionRangeOptions_Declaration *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  ulong uVar2;
  anon_union_32_1_493b367e_for_ExtensionRangeOptions_Declaration_4 aVar3;
  uint8_t *puVar4;
  char *in_R9;
  string *psVar5;
  string_view field_name;
  string_view field_name_00;
  
  aVar3 = this->field_0;
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x4) != (undefined1  [32])0x0) {
    target = internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.number_,target);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
    psVar5 = (string *)
             ((ulong)(this->field_0)._impl_.full_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"google.protobuf.ExtensionRangeOptions.Declaration.full_name";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(psVar5->_M_dataplus)._M_p,
               (char *)(ulong)(uint)psVar5->_M_string_length,1,0x3b,field_name);
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,psVar5,target);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x2) != (undefined1  [32])0x0) {
    psVar5 = (string *)((ulong)(this->field_0)._impl_.type_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name_00._M_str = in_R9;
    field_name_00._M_len = (size_t)"google.protobuf.ExtensionRangeOptions.Declaration.type";
    internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)(psVar5->_M_dataplus)._M_p,
               (char *)(ulong)(uint)psVar5->_M_string_length,1,0x36,field_name_00);
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,3,psVar5,target);
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x8) != (undefined1  [32])0x0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.reserved_;
    *target = '(';
    target[1] = bVar1;
    target = target + 2;
  }
  if (((undefined1  [32])aVar3 & (undefined1  [32])0x10) != (undefined1  [32])0x0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = (this->field_0)._impl_.repeated_;
    *target = '0';
    target[1] = bVar1;
    target = target + 2;
  }
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return target;
  }
  puVar4 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar4;
}

Assistant:

::uint8_t* ExtensionRangeOptions_Declaration::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const ExtensionRangeOptions_Declaration& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.ExtensionRangeOptions.Declaration)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          cached_has_bits = this_._impl_._has_bits_[0];
          // optional int32 number = 1;
          if (cached_has_bits & 0x00000004u) {
            target = ::google::protobuf::internal::WireFormatLite::
                WriteInt32ToArrayWithField<1>(
                    stream, this_._internal_number(), target);
          }

          // optional string full_name = 2;
          if (cached_has_bits & 0x00000001u) {
            const std::string& _s = this_._internal_full_name();
            ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                        "google.protobuf.ExtensionRangeOptions.Declaration.full_name");
            target = stream->WriteStringMaybeAliased(2, _s, target);
          }

          // optional string type = 3;
          if (cached_has_bits & 0x00000002u) {
            const std::string& _s = this_._internal_type();
            ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                        "google.protobuf.ExtensionRangeOptions.Declaration.type");
            target = stream->WriteStringMaybeAliased(3, _s, target);
          }

          // optional bool reserved = 5;
          if (cached_has_bits & 0x00000008u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                5, this_._internal_reserved(), target);
          }

          // optional bool repeated = 6;
          if (cached_has_bits & 0x00000010u) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteBoolToArray(
                6, this_._internal_repeated(), target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.ExtensionRangeOptions.Declaration)
          return target;
        }